

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
just::test::assert_equal_container::
run<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
          (assert_equal_container *this,vector<int,_std::allocator<int>_> *a_,
          vector<double,_std::allocator<double>_> *b_)

{
  double *pdVar1;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  double *pdVar5;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> i;
  ostringstream s;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Expected: ",10);
  show<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish,(ostream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," == ",4);
  pdVar5 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar1 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
  if (pdVar5 != pdVar1) {
    bVar3 = true;
    do {
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      std::ostream::_M_insert<double>(*pdVar5);
      pdVar5 = pdVar5 + 1;
      bVar3 = false;
    } while (pdVar5 != pdVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  piVar4 = (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar5 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar1 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pdVar5 != pdVar1 && piVar4 != piVar2) {
    while ((*pdVar5 == (double)*piVar4 && (!NAN(*pdVar5) && !NAN((double)*piVar4)))) {
      piVar4 = piVar4 + 1;
      pdVar5 = pdVar5 + 1;
      if ((piVar4 == piVar2) || (pdVar5 == pdVar1)) break;
    }
  }
  assert_msg::operator()(&this->_assert_msg,&local_1c8,pdVar5 == pdVar1 && piVar4 == piVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void run(const A& a_, const B& b_) const
      {
        std::ostringstream s;
        s << "Expected: ";
        show(a_.begin(), a_.end(), s);
        s << " == ";
        show(b_.begin(), b_.end(), s);

        _assert_msg(
          s.str(),
          ::just::test::equal(a_.begin(), a_.end(), b_.begin(), b_.end())
        );
      }